

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

OpCodeAsmJs __thiscall
Wasm::WasmBytecodeGenerator::GetLoadOp(WasmBytecodeGenerator *this,WasmType wasmType)

{
  code *pcVar1;
  bool bVar2;
  OpCodeAsmJs OVar3;
  undefined4 *puVar4;
  WasmCompilationException *this_00;
  
  switch(wasmType) {
  case FirstLocalType:
    OVar3 = Ld_Int;
    break;
  case I64:
    OVar3 = Ld_Long;
    break;
  case F32:
    OVar3 = Ld_Flt;
    break;
  case F64:
    OVar3 = Ld_Db;
    break;
  case V128:
    Simd::EnsureSimdIsEnabled();
    OVar3 = Simd128_Ld_F4;
    break;
  default:
switchD_00f35910_caseD_6:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this_00,L"Unknown load operator %u",wasmType)
    ;
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  case Any:
    if (this->isUnreachable == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x712,"(IsUnreachable())","IsUnreachable()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    OVar3 = Ld_Int;
    if (this->isUnreachable == false) goto switchD_00f35910_caseD_6;
  }
  return OVar3;
}

Assistant:

Js::OpCodeAsmJs WasmBytecodeGenerator::GetLoadOp(WasmTypes::WasmType wasmType)
{
    switch (wasmType)
    {
    case WasmTypes::F32:
        return Js::OpCodeAsmJs::Ld_Flt;
    case WasmTypes::F64:
        return Js::OpCodeAsmJs::Ld_Db;
    case WasmTypes::I32:
        return Js::OpCodeAsmJs::Ld_Int;
    case WasmTypes::I64:
        return Js::OpCodeAsmJs::Ld_Long;
#ifdef ENABLE_WASM_SIMD
    case WasmTypes::V128:
        Simd::EnsureSimdIsEnabled();
        return Js::OpCodeAsmJs::Simd128_Ld_F4;
#endif
    case WasmTypes::Any:
        // In unreachable mode load the any type like an int since we won't actually emit the load
        Assert(IsUnreachable());
        if (IsUnreachable())
        {
            return Js::OpCodeAsmJs::Ld_Int;
        }
    default:
        WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
        throw WasmCompilationException(_u("Unknown load operator %u"), wasmType);
    }
}